

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MixedBindingCase::deinit(MixedBindingCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MixedBindingCase *this_local;
  
  if (this->m_posBuffer != 0) {
    pRVar2 = gles31::Context::getRenderContext
                       ((this->super_BindingRenderCase).super_TestCase.m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_posBuffer);
    this->m_posBuffer = 0;
  }
  if (this->m_colorOffsetBuffer != 0) {
    pRVar2 = gles31::Context::getRenderContext
                       ((this->super_BindingRenderCase).super_TestCase.m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_colorOffsetBuffer);
    this->m_colorOffsetBuffer = 0;
  }
  BindingRenderCase::deinit(&this->super_BindingRenderCase);
  return;
}

Assistant:

void MixedBindingCase::deinit (void)
{
	if (m_posBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_posBuffer);
		m_posBuffer = DE_NULL;
	}

	if (m_colorOffsetBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_colorOffsetBuffer);
		m_colorOffsetBuffer = DE_NULL;
	}

	BindingRenderCase::deinit();
}